

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O1

Gia_Obj_t * Cbs0_ManDecideMaxFF(Cbs0_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  int iVar8;
  Gia_Obj_t *pGVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  
  pGVar4 = p->pAig;
  piVar5 = pGVar4->pRefs;
  if (piVar5 == (int *)0x0) {
    __assert_fail("p->pAig->pRefs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                  ,0x18b,"Gia_Obj_t *Cbs0_ManDecideMaxFF(Cbs0_Man_t *)");
  }
  iVar11 = (p->pJust).iHead;
  lVar10 = (long)iVar11;
  iVar3 = (p->pJust).iTail;
  if (iVar11 < iVar3) {
    pGVar9 = (Gia_Obj_t *)0x0;
    iVar11 = 0;
    do {
      pGVar6 = (p->pJust).pData[lVar10];
      if (pGVar6 == (Gia_Obj_t *)0x0) {
        return pGVar9;
      }
      if (((ulong)pGVar6 & 1) != 0) {
        __assert_fail("!Gia_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                      ,0x14b,"int Cbs0_VarFaninFanoutMax(Cbs0_Man_t *, Gia_Obj_t *)");
      }
      uVar12 = (uint)*(undefined8 *)pGVar6;
      if (((int)uVar12 < 0) || (uVar12 = uVar12 & 0x1fffffff, uVar12 == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                      ,0x14c,"int Cbs0_VarFaninFanoutMax(Cbs0_Man_t *, Gia_Obj_t *)");
      }
      pGVar1 = pGVar6 + -(ulong)uVar12;
      pGVar7 = pGVar4->pObjs;
      if ((((pGVar1 < pGVar7) || (pGVar7 + pGVar4->nObjs <= pGVar1)) ||
          (pGVar2 = pGVar6 + -(ulong)((uint)((ulong)*(undefined8 *)pGVar6 >> 0x20) & 0x1fffffff),
          pGVar2 < pGVar7)) || (pGVar7 + pGVar4->nObjs <= pGVar2)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar13 = piVar5[(int)((ulong)((long)pGVar2 - (long)pGVar7) >> 2) * -0x55555555];
      if (piVar5[(int)((ulong)((long)pGVar2 - (long)pGVar7) >> 2) * -0x55555555] <
          piVar5[(int)((ulong)((long)pGVar1 - (long)pGVar7) >> 2) * -0x55555555]) {
        iVar13 = piVar5[(int)((ulong)((long)pGVar1 - (long)pGVar7) >> 2) * -0x55555555];
      }
      if (iVar13 < 1) {
        __assert_fail("iCurFF > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                      ,399,"Gia_Obj_t *Cbs0_ManDecideMaxFF(Cbs0_Man_t *)");
      }
      iVar8 = iVar11;
      if (iVar11 <= iVar13) {
        iVar8 = iVar13;
      }
      if (iVar11 < iVar13) {
        pGVar9 = pGVar6;
      }
      lVar10 = lVar10 + 1;
      iVar11 = iVar8;
    } while (iVar3 != lVar10);
  }
  else {
    pGVar9 = (Gia_Obj_t *)0x0;
  }
  return pGVar9;
}

Assistant:

static inline Gia_Obj_t * Cbs0_ManDecideMaxFF( Cbs0_Man_t * p )
{
    Gia_Obj_t * pObj, * pObjMax = NULL;
    int i, iMaxFF = 0, iCurFF;
    assert( p->pAig->pRefs != NULL );
    Cbs0_QueForEachEntry( p->pJust, pObj, i )
    {
        iCurFF = Cbs0_VarFaninFanoutMax( p, pObj );
        assert( iCurFF > 0 );
        if ( iMaxFF < iCurFF )
        {
            iMaxFF = iCurFF;
            pObjMax = pObj;
        }
    }
    return pObjMax;
}